

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O1

WebPMuxError CreateFrameData(int width,int height,WebPMuxFrameInfo *info,WebPData *frame)

{
  WebPMuxError WVar1;
  uint8_t *puVar2;
  int iVar3;
  
  puVar2 = (uint8_t *)WebPSafeMalloc(1,0x10);
  if (puVar2 == (uint8_t *)0x0) {
    WVar1 = WEBP_MUX_MEMORY_ERROR;
  }
  else {
    iVar3 = info->x_offset / 2;
    *puVar2 = (uint8_t)iVar3;
    puVar2[1] = (uint8_t)((uint)iVar3 >> 8);
    puVar2[2] = (uint8_t)((uint)iVar3 >> 0x10);
    iVar3 = info->y_offset / 2;
    puVar2[3] = (uint8_t)iVar3;
    puVar2[4] = (uint8_t)((uint)iVar3 >> 8);
    puVar2[5] = (uint8_t)((uint)iVar3 >> 0x10);
    iVar3 = width + -1;
    puVar2[6] = (uint8_t)iVar3;
    puVar2[7] = (uint8_t)((uint)iVar3 >> 8);
    puVar2[8] = (uint8_t)((uint)iVar3 >> 0x10);
    iVar3 = height + -1;
    puVar2[9] = (uint8_t)iVar3;
    puVar2[10] = (uint8_t)((uint)iVar3 >> 8);
    puVar2[0xb] = (uint8_t)((uint)iVar3 >> 0x10);
    iVar3 = info->duration;
    puVar2[0xc] = (uint8_t)iVar3;
    puVar2[0xd] = (uint8_t)((uint)iVar3 >> 8);
    puVar2[0xe] = (uint8_t)((uint)iVar3 >> 0x10);
    puVar2[0xf] = info->dispose_method == WEBP_MUX_DISPOSE_BACKGROUND |
                  (info->blend_method == WEBP_MUX_NO_BLEND) * '\x02';
    frame->bytes = puVar2;
    frame->size = 0x10;
    WVar1 = WEBP_MUX_OK;
  }
  return WVar1;
}

Assistant:

static WebPMuxError CreateFrameData(
    int width, int height, const WebPMuxFrameInfo* const info,
    WebPData* const frame) {
  uint8_t* frame_bytes;
  const size_t frame_size = kChunks[IDX_ANMF].size;

  assert(width > 0 && height > 0 && info->duration >= 0);
  assert(info->dispose_method == (info->dispose_method & 1));
  // Note: assertion on upper bounds is done in PutLE24().

  frame_bytes = (uint8_t*)WebPSafeMalloc(1ULL, frame_size);
  if (frame_bytes == NULL) return WEBP_MUX_MEMORY_ERROR;

  PutLE24(frame_bytes + 0, info->x_offset / 2);
  PutLE24(frame_bytes + 3, info->y_offset / 2);

  PutLE24(frame_bytes + 6, width - 1);
  PutLE24(frame_bytes + 9, height - 1);
  PutLE24(frame_bytes + 12, info->duration);
  frame_bytes[15] =
      (info->blend_method == WEBP_MUX_NO_BLEND ? 2 : 0) |
      (info->dispose_method == WEBP_MUX_DISPOSE_BACKGROUND ? 1 : 0);

  frame->bytes = frame_bytes;
  frame->size = frame_size;
  return WEBP_MUX_OK;
}